

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::AddInventory(APlayerPawn *this,AInventory *item)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  AInventory *item_local;
  APlayerPawn *this_local;
  
  if ((((this->super_AActor).player == (player_t *)0x0) ||
      (((this->super_AActor).player)->mo == this)) ||
     (((this->super_AActor).player)->mo == (APlayerPawn *)0x0)) {
    AActor::AddInventory(&this->super_AActor,item);
    bVar2 = TObjPtr<AInventory>::operator==(&this->InvSel,(AInventory *)0x0);
    if ((bVar2) && ((item->ItemFlags & 0x40) != 0)) {
      TObjPtr<AInventory>::operator=(&this->InvSel,item);
    }
  }
  else {
    pAVar1 = ((this->super_AActor).player)->mo;
    (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x14])(pAVar1,item);
  }
  return;
}

Assistant:

void APlayerPawn::AddInventory (AInventory *item)
{
	// Adding inventory to a voodoo doll should add it to the real player instead.
	if (player != NULL && player->mo != this && player->mo != NULL)
	{
		player->mo->AddInventory (item);
		return;
	}
	Super::AddInventory (item);

	// If nothing is selected, select this item.
	if (InvSel == NULL && (item->ItemFlags & IF_INVBAR))
	{
		InvSel = item;
	}
}